

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void duckdb::Node::DeleteChild
               (ART *art,Node *node,Node *prefix,uint8_t byte,GateStatus status,ARTKey *row_id)

{
  NType NVar1;
  InternalException *this;
  allocator local_59;
  string local_58;
  string local_38;
  
  NVar1 = (NType)((node->super_IndexPointer).data >> 0x38);
  switch(NVar1 & 0x7f) {
  case NODE_4:
    Node4::DeleteChild(art,node,prefix,byte,status);
    return;
  case NODE_16:
    Node16::DeleteChild(art,node,byte);
    return;
  case NODE_48:
    Node48::DeleteChild(art,node,byte);
    return;
  case NODE_256:
    Node256::DeleteChild(art,node,byte);
    return;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Invalid node type for DeleteChild: %s.",&local_59);
    EnumUtil::ToString<duckdb::NType>(&local_58,NVar1 & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this,&local_38,&local_58);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case NODE_7_LEAF:
    Node7Leaf::DeleteByte(art,node,prefix,byte,row_id);
    return;
  case NODE_15_LEAF:
    Node15Leaf::DeleteByte(art,node,byte);
    return;
  case NODE_256_LEAF:
    Node256Leaf::DeleteByte(art,node,byte);
    return;
  }
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}